

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O2

Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> __thiscall
capnp::MembraneHook::whenMoreResolved(MembraneHook *this)

{
  SourceLocation location;
  void **this_00;
  bool bVar1;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  aVar2;
  long in_RSI;
  Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> MVar3;
  NullableValue<kj::Promise<void>_> _r504;
  NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> _promise503;
  void *local_80;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  local_78;
  NullableValue<kj::Promise<void>_> local_70;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_60;
  NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> local_58;
  char *local_48;
  char *pcStack_40;
  undefined8 local_38;
  FixVoid<kj::Own<capnp::ClientHook>_> local_30;
  
  if (*(long **)(in_RSI + 0x50) == (long *)0x0) {
    (**(code **)(**(long **)(in_RSI + 0x28) + 0x18))
              ((NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> *)&local_80
              );
    bVar1 = local_80._0_1_;
    local_58.isSet = local_80._0_1_;
    if (local_80._0_1_ == true) {
      local_58.field_1 = local_78;
      local_78 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
                  )0x0;
    }
    kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::~NullableValue
              ((NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> *)&local_80
              );
    if (bVar1 == false) {
      *(undefined1 *)&(this->super_ClientHook)._vptr_ClientHook = 0;
    }
    else {
      (**(code **)(**(long **)(in_RSI + 0x38) + 0x18))(&local_70);
      local_80 = (void *)CONCAT71(local_80._1_7_,local_70.isSet);
      if (local_70.isSet == true) {
        local_78 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
                    )local_70.field_1;
        local_70.field_1 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
      }
      kj::_::NullableValue<kj::Promise<void>_>::~NullableValue(&local_70);
      this_00 = (void **)&local_58.field_1;
      if (local_70.isSet != false) {
        kj::Promise<void>::then<capnp::MembraneHook::whenMoreResolved()::_lambda()_1_>
                  ((Promise<void> *)&local_60,(anon_class_1_0_00000001_for_func *)&local_78.value);
        local_48 = 
        "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane.c++"
        ;
        pcStack_40 = "whenMoreResolved";
        local_38 = 0x13000001f9;
        location.function = "whenMoreResolved";
        location.fileName =
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane.c++"
        ;
        location.lineNumber = 0x1f9;
        location.columnNumber = 0x13;
        kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::exclusiveJoin
                  ((Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)&local_70,
                   (Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)this_00,location);
        kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
                  ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this_00,
                   (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_70);
        kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                  ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_70);
        kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_60);
      }
      kj::_::NullableValue<kj::Promise<void>_>::~NullableValue
                ((NullableValue<kj::Promise<void>_> *)&local_80);
      kj::Promise<kj::Own<capnp::ClientHook,decltype(nullptr)>>::
      then<capnp::MembraneHook::whenMoreResolved()::_lambda(kj::Own<capnp::ClientHook,decltype(nullptr)>&&)_1_>
                ((Promise<kj::Own<capnp::ClientHook,decltype(nullptr)>> *)&local_80,
                 (anon_class_8_1_8991fb9c_for_func *)this_00);
      *(undefined1 *)&(this->super_ClientHook)._vptr_ClientHook = 1;
      (this->super_ClientHook).brand = local_80;
      local_80 = (void *)0x0;
      kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_80);
    }
    kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::~NullableValue
              (&local_58);
    aVar2 = extraout_RDX_00;
  }
  else {
    (**(code **)(**(long **)(in_RSI + 0x50) + 0x20))(&local_30);
    kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::Promise
              ((Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)&local_58,&local_30);
    *(undefined1 *)&(this->super_ClientHook)._vptr_ClientHook = 1;
    (this->super_ClientHook).brand = (void *)local_58._0_8_;
    local_58._0_8_ = (PromiseNode *)0x0;
    kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_58);
    kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&local_30);
    aVar2 = extraout_RDX;
  }
  MVar3.ptr.field_1 = aVar2;
  MVar3.ptr._0_8_ = this;
  return (Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>)MVar3.ptr;
}

Assistant:

kj::Maybe<kj::Promise<kj::Own<ClientHook>>> whenMoreResolved() override {
    KJ_IF_SOME(r, resolved) {
      return kj::Promise<kj::Own<ClientHook>>(r.get()->addRef());
    }

    KJ_IF_SOME(promise, inner->whenMoreResolved()) {
      KJ_IF_SOME(r, policy->onRevoked()) {
        promise = promise.exclusiveJoin(r.then([]() -> kj::Own<ClientHook> {
          KJ_FAIL_REQUIRE("onRevoked() promise resolved; it should only reject");
        }));
      }

      return promise.then([this](kj::Own<ClientHook>&& newInner) {
        // There's a chance resolved was set by getResolved() or a concurrent whenMoreResolved()
        // while we yielded the event loop. If the inner ClientHook is maintaining the contract,
        // then resolved would already be set to newInner after wrapping in a MembraneHook.
        KJ_IF_SOME(r, resolved) {
          return r->addRef();
        } else {
          return resolved.emplace(wrap(*newInner, *policy, reverse))->addRef();
        }
      });
    } else {
      return kj::none;
    }
  }